

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

void Dau_DecTrySets(word *pInit,int nVars,int fVerbose)

{
  uint set;
  Vec_Int_t *p;
  uint uVar1;
  uint uSet;
  uint i;
  
  if (nVars < 0x11) {
    p = Dau_DecFindSets(pInit,nVars);
    if (fVerbose != 0) {
      Dau_DsdPrintFromTruth(pInit,nVars);
      uVar1 = p->nSize;
      printf("This %d-variable function has %d decomposable variable sets:\n",(ulong)(uint)nVars,
             (ulong)uVar1);
      if ((int)uVar1 < 1) {
        uVar1 = 0;
      }
      for (i = 0; uVar1 != i; i = i + 1) {
        set = Vec_IntEntry(p,i);
        printf("Set %4d : ",(ulong)i);
        if (nVars < 7) {
          Dau_DecPrintSet(set,nVars,1);
          Dau_DecPerform6(pInit,nVars,set);
        }
        else {
          Dau_DecPrintSet(set,nVars,0);
          Dau_DecPerform(pInit,nVars,set);
        }
      }
    }
    Vec_IntFree(p);
    return;
  }
  __assert_fail("nVars <= 16",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/opt/dau/dauNonDsd.c"
                ,0x343,"void Dau_DecTrySets(word *, int, int)");
}

Assistant:

void Dau_DecTrySets( word * pInit, int nVars, int fVerbose )
{
    Vec_Int_t * vSets;
    int i, Entry;
    assert( nVars <= 16 );
    vSets = Dau_DecFindSets( pInit, nVars );
    if ( !fVerbose )
    {
        Vec_IntFree( vSets );
        return;
    }
    Dau_DsdPrintFromTruth( pInit, nVars ); 
    printf( "This %d-variable function has %d decomposable variable sets:\n", nVars, Vec_IntSize(vSets) );
    Vec_IntForEachEntry( vSets, Entry, i )
    {
        unsigned uSet = (unsigned)Entry;
        printf( "Set %4d : ", i );
        if ( nVars > 6 )
        {
            Dau_DecPrintSet( uSet, nVars, 0 );
            Dau_DecPerform( pInit, nVars, uSet );
        }
        else
        {
            Dau_DecPrintSet( uSet, nVars, 1 );
            Dau_DecPerform6( pInit, nVars, uSet );
        }
    }
    Vec_IntFree( vSets );
//    printf( "\n" );
}